

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O2

void __thiscall Dialog::~Dialog(Dialog *this)

{
  this->display = (ALLEGRO_DISPLAY *)0x0;
  al_destroy_event_queue(this->event_queue);
  this->event_queue = (ALLEGRO_EVENT_QUEUE *)0x0;
  std::__cxx11::_List_base<Widget_*,_std::allocator<Widget_*>_>::_M_clear
            (&(this->all_widgets).super__List_base<Widget_*,_std::allocator<Widget_*>_>);
  return;
}

Assistant:

Dialog::~Dialog()
{
   this->display = NULL;

   al_destroy_event_queue(this->event_queue);
   this->event_queue = NULL;
}